

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QRectF>::insert
          (QMovableArrayOps<QRectF> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  long lVar5;
  qsizetype qVar6;
  QRectF *pQVar7;
  qsizetype inserts;
  bool bVar8;
  
  qVar1 = t->xp;
  qVar2 = t->yp;
  qVar3 = t->w;
  qVar4 = t->h;
  bVar8 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size != 0;
  QArrayDataPointer<QRectF>::detachAndGrow
            ((QArrayDataPointer<QRectF> *)this,(uint)(i == 0 && bVar8),n,(QRectF **)0x0,
             (QArrayDataPointer<QRectF> *)0x0);
  if (i == 0 && bVar8) {
    if (n == 0) {
      return;
    }
    pQVar7 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
    lVar5 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
    qVar6 = n;
    do {
      pQVar7[-1].xp = qVar1;
      pQVar7[-1].yp = qVar2;
      pQVar7[-1].w = qVar3;
      pQVar7[-1].h = qVar4;
      pQVar7 = pQVar7 + -1;
      qVar6 = qVar6 + -1;
    } while (qVar6 != 0);
    (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr = pQVar7;
  }
  else {
    pQVar7 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr + i;
    memmove(pQVar7 + n,pQVar7,
            ((this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size - i) * 0x20
           );
    lVar5 = n;
    if (n != 0) {
      do {
        pQVar7->xp = qVar1;
        pQVar7->yp = qVar2;
        pQVar7->w = qVar3;
        pQVar7->h = qVar4;
        pQVar7 = pQVar7 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    lVar5 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
  }
  (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size = lVar5 + n;
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }